

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O3

bool leveldb::GetVarint32(Slice *input,uint32_t *value)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  size_t sVar4;
  byte *pbVar5;
  bool bVar6;
  uint uVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  sVar4 = input->size_;
  if ((long)sVar4 < 1) {
    bVar6 = false;
  }
  else {
    pbVar5 = (byte *)input->data_;
    bVar2 = *pbVar5;
    uVar9 = (uint)bVar2;
    if ((char)bVar2 < '\0') {
      pbVar8 = pbVar5 + 1;
      uVar10 = 0;
      uVar7 = 0;
      do {
        bVar6 = false;
        if ((0x15 < uVar7) || (bVar6 = false, pbVar5 + sVar4 <= pbVar8)) goto LAB_00d070c6;
        uVar1 = uVar7 + 7;
        uVar10 = uVar10 | (uVar9 & 0x7f) << ((byte)uVar7 & 0x1f);
        bVar2 = *pbVar8;
        uVar9 = (uint)bVar2;
        pbVar8 = pbVar8 + 1;
        uVar7 = uVar1;
      } while ((char)bVar2 < '\0');
      *value = uVar9 << ((byte)uVar1 & 0x1f) | uVar10;
    }
    else {
      *value = (uint)bVar2;
      pbVar8 = pbVar5 + 1;
    }
    input->data_ = (char *)pbVar8;
    input->size_ = (long)(pbVar5 + sVar4) - (long)pbVar8;
    bVar6 = true;
  }
LAB_00d070c6:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool GetVarint32(Slice* input, uint32_t* value) {
  const char* p = input->data();
  const char* limit = p + input->size();
  const char* q = GetVarint32Ptr(p, limit, value);
  if (q == nullptr) {
    return false;
  } else {
    *input = Slice(q, limit - q);
    return true;
  }
}